

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::handle_disk_error
          (torrent *this,string_view job_name,storage_error *error,peer_connection *c,disk_class rw)

{
  uint uVar1;
  error_category *peVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string local_b0;
  undefined1 local_90 [48];
  error_condition local_60;
  error_condition local_50;
  error_condition local_40;
  
  local_90._40_8_ = c;
  iVar5 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((char)iVar5 != '\0') {
    uVar1 = (error->ec).val_;
    peVar2 = (error->ec).cat_;
    (*peVar2->_vptr_error_category[4])(&local_b0,peVar2,(ulong)uVar1);
    local_90._32_8_ = operation_name(error->operation);
    resolve_filename_abi_cxx11_
              ((string *)local_90,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"disk error: (%d) %s [%*s : %s] in file: %s",(ulong)uVar1,
               local_b0._M_dataplus._M_p,job_name._M_len & 0xffffffff,job_name._M_str,
               local_90._32_8_,local_90._0_8_);
    ::std::__cxx11::string::~string((string *)local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  local_b0._0_16_ = boost::system::errc::make_error_condition(not_enough_memory);
  bVar4 = boost::system::operator==(&error->ec,(error_condition *)&local_b0);
  if (bVar4) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    uVar3 = local_90._40_8_;
    if ((*(uint *)(CONCAT44(extraout_var,iVar5) + 0x68) & 0x49) != 0) {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      resolve_filename_abi_cxx11_(&local_b0,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
      get_handle((torrent *)local_90);
      alert_manager::
      emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar5),&error->ec,&local_b0,
                 &error->operation,(torrent_handle *)local_90);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
      ::std::__cxx11::string::~string((string *)&local_b0);
    }
    if ((peer_connection *)uVar3 == (peer_connection *)0x0) {
      return;
    }
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&local_b0,no_memory,(type *)0x0);
    (*((bandwidth_socket *)uVar3)->_vptr_bandwidth_socket[0x14])
              (uVar3,&local_b0,(ulong)error->operation,0);
    return;
  }
  local_b0._0_16_ = boost::asio::error::make_error_code(operation_aborted);
  bVar4 = boost::system::operator==(&error->ec,(error_code *)&local_b0);
  if (bVar4) {
    return;
  }
  iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var_01,iVar5) + 0x68) & 0x49) != 0) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    resolve_filename_abi_cxx11_(&local_b0,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
    get_handle((torrent *)local_90);
    alert_manager::
    emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
              ((alert_manager *)CONCAT44(extraout_var_02,iVar5),&error->ec,&local_b0,
               &error->operation,(torrent_handle *)local_90);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  if (rw == write) {
    local_b0._0_16_ = boost::system::errc::make_error_condition(read_only_file_system);
    bVar4 = boost::system::operator==(&error->ec,(error_condition *)&local_b0);
    if (!bVar4) {
      local_90._0_16_ =
           (undefined1  [16])boost::system::errc::make_error_condition(permission_denied);
      bVar4 = boost::system::operator==(&error->ec,(error_condition *)local_90);
      if (!bVar4) {
        local_40 = boost::system::errc::make_error_condition(operation_not_permitted);
        bVar4 = boost::system::operator==(&error->ec,&local_40);
        if (!bVar4) {
          local_50 = boost::system::errc::make_error_condition(no_space_on_device);
          bVar4 = boost::system::operator==(&error->ec,&local_50);
          if (!bVar4) {
            local_60 = boost::system::errc::make_error_condition(file_too_large);
            bVar4 = boost::system::operator==(&error->ec,&local_60);
            if (!bVar4) goto LAB_002d2492;
          }
        }
      }
    }
    set_upload_mode(this,true);
  }
  else {
LAB_002d2492:
    set_error(this,&error->ec,(file_index_t)(int)*(int3 *)&error->field_0x10);
    pause(this);
  }
  return;
}

Assistant:

void torrent::handle_disk_error(string_view job_name
		, storage_error const& error
		, peer_connection* c
		, disk_class rw)
	{
		TORRENT_UNUSED(job_name);
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(error);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("disk error: (%d) %s [%*s : %s] in file: %s"
				, error.ec.value(), error.ec.message().c_str()
				, int(job_name.size()), job_name.data()
				, operation_name(error.operation)
				, resolve_filename(error.file()).c_str());
		}
#endif

		if (error.ec == boost::system::errc::not_enough_memory)
		{
			if (alerts().should_post<file_error_alert>())
				alerts().emplace_alert<file_error_alert>(error.ec
					, resolve_filename(error.file()), error.operation, get_handle());
			if (c) c->disconnect(errors::no_memory, error.operation);
			return;
		}

		if (error.ec == boost::asio::error::operation_aborted) return;

		// notify the user of the error
		if (alerts().should_post<file_error_alert>())
			alerts().emplace_alert<file_error_alert>(error.ec
				, resolve_filename(error.file()), error.operation, get_handle());

		// if a write operation failed, and future writes are likely to
		// fail, while reads may succeed, just set the torrent to upload mode
		// if we make an incorrect assumption here, it's not the end of the
		// world, if we ever issue a read request and it fails as well, we
		// won't get in here and we'll actually end up pausing the torrent
		if (rw == disk_class::write
			&& (error.ec == boost::system::errc::read_only_file_system
			|| error.ec == boost::system::errc::permission_denied
			|| error.ec == boost::system::errc::operation_not_permitted
			|| error.ec == boost::system::errc::no_space_on_device
			|| error.ec == boost::system::errc::file_too_large))
		{
			// if we failed to write, stop downloading and just
			// keep seeding.
			// TODO: 1 make this depend on the error and on the filesystem the
			// files are being downloaded to. If the error is no_space_left_on_device
			// and the filesystem doesn't support sparse files, only zero the priorities
			// of the pieces that are at the tails of all files, leaving everything
			// up to the highest written piece in each file
			set_upload_mode(true);
			return;
		}

		// put the torrent in an error-state
		set_error(error.ec, error.file());

		// if the error appears to be more serious than a full disk, just pause the torrent
		pause();
	}